

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::expression
          (Compiler *this,Ptr *node,ReturnType t,uint16_t write_index,uint16_t *extent_index,
          bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  element_type *peVar6;
  Atom *pAVar7;
  shared_ptr<r_comp::RepliStruct> local_1f0;
  Atom local_1e0 [4];
  Atom local_1dc [4];
  shared_ptr<r_comp::RepliStruct> local_1d8;
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [38];
  byte local_17a;
  byte local_179;
  undefined1 local_178 [6];
  uint8_t variable_index;
  uint8_t tail_write_index;
  string local_168 [32];
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  string local_108 [36];
  undefined4 local_e4;
  shared_ptr<r_comp::RepliStruct> local_e0;
  undefined1 local_d0 [8];
  Class p;
  string local_58 [8];
  string label;
  bool lbl;
  bool write_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  ReturnType t_local;
  Ptr *node_local;
  Compiler *this_local;
  
  peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  if (peVar6->type != Structure) {
    return false;
  }
  std::__cxx11::string::string(local_58);
  peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar3 = std::operator!=(&peVar6->label,"");
  if (bVar3) {
    peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )node);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&p.type,(ulong)&peVar6->label);
    std::__cxx11::string::operator=(local_58,(string *)&p.type);
    std::__cxx11::string::~string((string *)&p.type);
  }
  Class::Class((Class *)local_d0,ANY);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
  bVar4 = expression_head(this,&local_e0,(Class *)local_d0,t);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    if ((bVar3) && ((this->in_hlp & 1U) == 0)) {
      std::__cxx11::string::string(local_108,local_58);
      bVar4 = addLocalReference(this,(string *)local_108,write_index,(Class *)local_d0);
      std::__cxx11::string::~string(local_108);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::find((char *)local_58,0x1ca90f);
        std::__cxx11::string::substr((ulong)local_168,(ulong)local_58);
        std::operator+((char *)local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "cast to ");
        std::operator+(local_128,(char *)local_148);
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)local_178,node);
        set_error(this,local_128,(shared_ptr<r_comp::RepliStruct> *)local_178);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)local_178);
        std::__cxx11::string::~string((string *)local_128);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string(local_168);
        this_local._7_1_ = false;
        goto LAB_00197115;
      }
    }
    local_179 = 0;
    if (write) {
      if ((bVar3) && ((this->in_hlp & 1U) != 0)) {
        std::__cxx11::string::string(local_1a0,local_58);
        bVar5 = get_hlp_reference(this,(string *)local_1a0);
        std::__cxx11::string::~string(local_1a0);
        local_17a = bVar5;
        if (bVar5 == 0xff) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c0," error: undeclared variable",&local_1c1);
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1d8,node);
          set_error(this,(string *)local_1c0,&local_1d8);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1d8);
          std::__cxx11::string::~string(local_1c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          this_local._7_1_ = false;
          goto LAB_00197115;
        }
        r_code::Atom::AssignmentPointer((uchar)local_1dc,(ushort)bVar5);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,local_1dc);
        r_code::Atom::~Atom(local_1dc);
      }
      else {
        r_code::Atom::IPointer((ushort)local_1e0);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,local_1e0);
        r_code::Atom::~Atom(local_1e0);
      }
      pIVar2 = this->current_object;
      uVar1 = *extent_index;
      *extent_index = uVar1 + 1;
      pAVar7 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar7,(Atom *)local_d0);
      local_179 = (byte)*extent_index;
      bVar5 = r_code::Atom::getAtomCount();
      *extent_index = *extent_index + (ushort)bVar5;
    }
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1f0,node);
    bVar3 = expression_tail(this,&local_1f0,(Class *)local_d0,(ushort)local_179,extent_index,write);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1f0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00197115:
  local_e4 = 1;
  Class::~Class((Class *)local_d0);
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool Compiler::expression(RepliStruct::Ptr node, const ReturnType t, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->type != RepliStruct::Structure) {
        return false;
    }

    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    Class p;

    if (!expression_head(node, p, t)) {
        return false;
    }

    if (lbl && !in_hlp) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint8_t tail_write_index = 0;

    if (write) {
        if (lbl && in_hlp) {
            uint8_t variable_index = get_hlp_reference(label);

            if (variable_index == 0xFF) {
                set_error(" error: undeclared variable", node);
                return false;
            }

            current_object->code[write_index] = Atom::AssignmentPointer(variable_index, extent_index);
        } else {
            current_object->code[write_index] = Atom::IPointer(extent_index);
        }

        current_object->code[extent_index++] = p.atom;
        tail_write_index = extent_index;
        extent_index += p.atom.getAtomCount();
    }

    if (!expression_tail(node, p, tail_write_index, extent_index, write)) {
        return false;
    }

    return true;
}